

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::AbsoluteDifference
               (uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
               uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
               uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint8_t uVar3;
  uint8_t *puVar4;
  uint8_t *local_120;
  byte *local_118;
  byte *local_110;
  uint8_t *local_d8;
  undefined1 (*local_d0) [16];
  undefined1 (*local_c8) [16];
  uint8_t *local_c0;
  undefined1 (*local_b8) [16];
  undefined1 (*local_b0) [16];
  undefined8 local_88;
  undefined8 uStack_80;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *in2X;
  uint8_t *in1X;
  simd data2;
  simd data1;
  simd *src1End;
  simd *dst;
  simd *src2;
  simd *src1;
  uint8_t *outY_local;
  
  local_b8 = (undefined1 (*) [16])in2Y;
  local_b0 = (undefined1 (*) [16])in1Y;
  for (local_c0 = outY; local_c0 != outYEnd; local_c0 = local_c0 + rowSizeOut) {
    local_d0 = local_b8;
    local_d8 = local_c0;
    for (local_c8 = local_b0; local_c8 != local_b0 + simdWidth; local_c8 = local_c8 + 1) {
      auVar1 = vpmaxub_avx(*local_c8,*local_d0);
      auVar2 = vpminub_avx(*local_c8,*local_d0);
      auVar1 = vpsubb_avx(auVar1,auVar2);
      local_88 = auVar1._0_8_;
      uStack_80 = auVar1._8_8_;
      *(undefined8 *)local_d8 = local_88;
      *(undefined8 *)(local_d8 + 8) = uStack_80;
      local_d0 = local_d0 + 1;
      local_d8 = local_d8 + 0x10;
    }
    if (nonSimdWidth != 0) {
      local_110 = *local_b0 + totalSimdWidth;
      local_118 = *local_b8 + totalSimdWidth;
      local_120 = local_c0 + totalSimdWidth;
      puVar4 = local_120 + nonSimdWidth;
      for (; local_120 != puVar4; local_120 = local_120 + 1) {
        if (*local_110 < *local_118) {
          uVar3 = *local_118 - *local_110;
        }
        else {
          uVar3 = *local_110 - *local_118;
        }
        *local_120 = uVar3;
        local_110 = local_110 + 1;
        local_118 = local_118 + 1;
      }
    }
    local_b0 = (undefined1 (*) [16])(*local_b0 + rowSizeIn1);
    local_b8 = (undefined1 (*) [16])(*local_b8 + rowSizeIn2);
  }
  return;
}

Assistant:

void AbsoluteDifference( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                             uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data1 = _mm_loadu_si128( src1 );
                simd data2 = _mm_loadu_si128( src2 );
                _mm_storeu_si128( dst, _mm_sub_epi8( _mm_max_epu8( data1, data2 ), _mm_min_epu8( data1, data2 ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? (*in2X) - (*in1X) : (*in1X) - (*in2X) );
            }
        }
    }